

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int lj_ffh_tonumber(lua_State *L)

{
  int32_t __base;
  int iVar1;
  TValue *pTVar2;
  CTState *cts_00;
  GCstr *pGVar3;
  ulong uVar4;
  lua_State *in_RDI;
  bool bVar5;
  undefined1 auVar6 [16];
  unsigned_long ul;
  char *ep;
  char *p;
  CType *ct;
  CTState *cts;
  TValue *o;
  int32_t base;
  CTState *cts_1;
  ErrMsg in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  uint6 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff36;
  undefined1 in_stack_ffffffffffffff37;
  undefined8 in_stack_ffffffffffffff38;
  lua_State *in_stack_ffffffffffffff40;
  CType *local_b0;
  CTInfo in_stack_ffffffffffffff7c;
  TValue *in_stack_ffffffffffffff80;
  uint8_t *in_stack_ffffffffffffff88;
  CType *in_stack_ffffffffffffff90;
  TValue *cts_01;
  
  __base = lj_lib_optint(in_stack_ffffffffffffff40,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                         (int32_t)in_stack_ffffffffffffff38);
  if (__base == 10) {
    pTVar2 = lj_lib_checkany((lua_State *)
                             CONCAT17(in_stack_ffffffffffffff37,
                                      CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30))
                             ,in_stack_ffffffffffffff2c);
    bVar5 = true;
    cts_01 = pTVar2;
    if ((0xfffeffff < (pTVar2->field_2).it) && (bVar5 = false, (pTVar2->field_2).it == 0xfffffffb))
    {
      iVar1 = lj_strscan_num((GCstr *)CONCAT17(1,(uint7)in_stack_ffffffffffffff30),
                             (TValue *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
                            );
      bVar5 = iVar1 != 0;
    }
    if (bVar5) {
      in_RDI->base[-1].u32 = *(anon_struct_8_2_f9ee98fb_for_u32 *)pTVar2;
      return 2;
    }
    if ((pTVar2->field_2).it == 0xfffffff5) {
      cts_00 = (CTState *)(ulong)*(uint *)((ulong)(in_RDI->glref).ptr32 + 0xfc);
      cts_00->L = in_RDI;
      local_b0 = lj_ctype_rawref(cts_00,(uint)*(ushort *)((ulong)(pTVar2->u32).lo + 6));
      if (local_b0->info >> 0x1c == 5) {
        local_b0 = cts_00->tab + (local_b0->info & 0xffff);
      }
      if ((local_b0->info >> 0x1c == 0) || ((local_b0->info & 0xf4000000) == 0x34000000)) {
        lj_cconv_ct_tv((CTState *)&cts_01->field_2,in_stack_ffffffffffffff90,
                       in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c
                      );
        return 2;
      }
    }
  }
  else {
    pGVar3 = lj_lib_checkstr(in_stack_ffffffffffffff40,
                             (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    if ((__base < 2) || (0x24 < __base)) {
      lj_err_arg((lua_State *)
                 CONCAT17(in_stack_ffffffffffffff37,
                          CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)),
                 in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
    }
    uVar4 = strtoul((char *)(pGVar3 + 1),(char **)&stack0xffffffffffffff40,__base);
    if ((lua_State *)(pGVar3 + 1) != in_stack_ffffffffffffff40) {
      while ((""[(ulong)(byte)(in_stack_ffffffffffffff40->nextgc).gcptr32 + 1] & 2) != 0) {
        in_stack_ffffffffffffff40 =
             (lua_State *)((long)&(in_stack_ffffffffffffff40->nextgc).gcptr32 + 1);
      }
      if ((char)(in_stack_ffffffffffffff40->nextgc).gcptr32 == '\0') {
        auVar6._8_4_ = (int)(uVar4 >> 0x20);
        auVar6._0_8_ = uVar4;
        auVar6._12_4_ = 0x45300000;
        in_RDI->base[-1].n =
             (auVar6._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0);
        return 2;
      }
    }
  }
  *(undefined4 *)((long)in_RDI->base + -4) = 0xffffffff;
  return 2;
}

Assistant:

LJLIB_ASM(tonumber)		LJLIB_REC(.)
{
  int32_t base = lj_lib_optint(L, 2, 10);
  if (base == 10) {
    TValue *o = lj_lib_checkany(L, 1);
    if (lj_strscan_numberobj(o)) {
      copyTV(L, L->base-1, o);
      return FFH_RES(1);
    }
#if LJ_HASFFI
    if (tviscdata(o)) {
      CTState *cts = ctype_cts(L);
      CType *ct = lj_ctype_rawref(cts, cdataV(o)->ctypeid);
      if (ctype_isenum(ct->info)) ct = ctype_child(cts, ct);
      if (ctype_isnum(ct->info) || ctype_iscomplex(ct->info)) {
	if (LJ_DUALNUM && ctype_isinteger_or_bool(ct->info) &&
	    ct->size <= 4 && !(ct->size == 4 && (ct->info & CTF_UNSIGNED))) {
	  int32_t i;
	  lj_cconv_ct_tv(cts, ctype_get(cts, CTID_INT32), (uint8_t *)&i, o, 0);
	  setintV(L->base-1, i);
	  return FFH_RES(1);
	}
	lj_cconv_ct_tv(cts, ctype_get(cts, CTID_DOUBLE),
		       (uint8_t *)&(L->base-1)->n, o, 0);
	return FFH_RES(1);
      }
    }
#endif
  } else {
    const char *p = strdata(lj_lib_checkstr(L, 1));
    char *ep;
    unsigned long ul;
    if (base < 2 || base > 36)
      lj_err_arg(L, 2, LJ_ERR_BASERNG);
    ul = strtoul(p, &ep, base);
    if (p != ep) {
      while (lj_char_isspace((unsigned char)(*ep))) ep++;
      if (*ep == '\0') {
	if (LJ_DUALNUM && LJ_LIKELY(ul < 0x80000000u))
	  setintV(L->base-1, (int32_t)ul);
	else
	  setnumV(L->base-1, (lua_Number)ul);
	return FFH_RES(1);
      }
    }
  }
  setnilV(L->base-1);
  return FFH_RES(1);
}